

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checkbox.cpp
# Opt level: O2

void __thiscall cursespp::Checkbox::SetText(Checkbox *this,string *value)

{
  bool bVar1;
  string sStack_38;
  
  bVar1 = std::operator!=(value,&this->originalText);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&this->originalText);
    decorate(&sStack_38,value,this->checked);
    TextLabel::SetText(&this->super_TextLabel,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return;
}

Assistant:

void Checkbox::SetText(const std::string& value) {
    if (value != this->originalText) {
        this->originalText = value;
        TextLabel::SetText(decorate(value, this->checked));
    }
}